

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3WalFindFrame(Wal *pWal,Pgno pgno,u32 *piRead)

{
  uint uVar1;
  u32 uVar2;
  int iVar3;
  u32 uVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  WalHashLoc sLoc;
  WalHashLoc local_48;
  
  uVar1 = (pWal->hdr).mxFrame;
  if ((uVar1 == 0) || ((pWal->readLock == 0 && (pWal->bShmUnreliable == '\0')))) {
    *piRead = 0;
  }
  else {
    uVar2 = pWal->minFrame;
    uVar8 = (ulong)(uVar1 + 0x1000) + 0xffffffff021 >> 0xc;
    while( true ) {
      iVar5 = (int)uVar8;
      if (iVar5 < (int)((ulong)(uVar2 + 0x1000) + 0xffffffff021 >> 0xc)) break;
      iVar3 = walHashGet(pWal,iVar5,&local_48);
      if (iVar3 != 0) {
        return iVar3;
      }
      uVar4 = 0;
      iVar3 = -0x2000;
      uVar6 = pgno * 0x17f;
      while( true ) {
        uVar6 = uVar6 & 0x1fff;
        if (local_48.aHash[uVar6] == 0) break;
        uVar7 = local_48.aHash[uVar6] + local_48.iZero;
        if (((uVar7 <= uVar1) && (pWal->minFrame <= uVar7)) &&
           (local_48.aPgno[local_48.aHash[uVar6]] == pgno)) {
          uVar4 = uVar7;
        }
        if (iVar3 == 0) {
          iVar5 = sqlite3CorruptError(0xef30);
          return iVar5;
        }
        uVar6 = uVar6 + 1;
        iVar3 = iVar3 + 1;
      }
      if (uVar4 != 0) goto LAB_0013437a;
      uVar8 = (ulong)(iVar5 - 1);
    }
    uVar4 = 0;
LAB_0013437a:
    *piRead = uVar4;
  }
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3WalFindFrame(
  Wal *pWal,                      /* WAL handle */
  Pgno pgno,                      /* Database page number to read data for */
  u32 *piRead                     /* OUT: Frame number (or zero) */
){
  u32 iRead = 0;                  /* If !=0, WAL frame to return data from */
  u32 iLast = pWal->hdr.mxFrame;  /* Last page in WAL for this reader */
  int iHash;                      /* Used to loop through N hash tables */
  int iMinHash;

  /* This routine is only be called from within a read transaction. */
  assert( pWal->readLock>=0 || pWal->lockError );

  /* If the "last page" field of the wal-index header snapshot is 0, then
  ** no data will be read from the wal under any circumstances. Return early
  ** in this case as an optimization.  Likewise, if pWal->readLock==0, 
  ** then the WAL is ignored by the reader so return early, as if the 
  ** WAL were empty.
  */
  if( iLast==0 || (pWal->readLock==0 && pWal->bShmUnreliable==0) ){
    *piRead = 0;
    return SQLITE_OK;
  }

  /* Search the hash table or tables for an entry matching page number
  ** pgno. Each iteration of the following for() loop searches one
  ** hash table (each hash table indexes up to HASHTABLE_NPAGE frames).
  **
  ** This code might run concurrently to the code in walIndexAppend()
  ** that adds entries to the wal-index (and possibly to this hash 
  ** table). This means the value just read from the hash 
  ** slot (aHash[iKey]) may have been added before or after the 
  ** current read transaction was opened. Values added after the
  ** read transaction was opened may have been written incorrectly -
  ** i.e. these slots may contain garbage data. However, we assume
  ** that any slots written before the current read transaction was
  ** opened remain unmodified.
  **
  ** For the reasons above, the if(...) condition featured in the inner
  ** loop of the following block is more stringent that would be required 
  ** if we had exclusive access to the hash-table:
  **
  **   (aPgno[iFrame]==pgno): 
  **     This condition filters out normal hash-table collisions.
  **
  **   (iFrame<=iLast): 
  **     This condition filters out entries that were added to the hash
  **     table after the current read-transaction had started.
  */
  iMinHash = walFramePage(pWal->minFrame);
  for(iHash=walFramePage(iLast); iHash>=iMinHash; iHash--){
    WalHashLoc sLoc;              /* Hash table location */
    int iKey;                     /* Hash slot index */
    int nCollide;                 /* Number of hash collisions remaining */
    int rc;                       /* Error code */

    rc = walHashGet(pWal, iHash, &sLoc);
    if( rc!=SQLITE_OK ){
      return rc;
    }
    nCollide = HASHTABLE_NSLOT;
    for(iKey=walHash(pgno); sLoc.aHash[iKey]; iKey=walNextHash(iKey)){
      u32 iFrame = sLoc.aHash[iKey] + sLoc.iZero;
      if( iFrame<=iLast && iFrame>=pWal->minFrame
       && sLoc.aPgno[sLoc.aHash[iKey]]==pgno ){
        assert( iFrame>iRead || CORRUPT_DB );
        iRead = iFrame;
      }
      if( (nCollide--)==0 ){
        return SQLITE_CORRUPT_BKPT;
      }
    }
    if( iRead ) break;
  }

#ifdef SQLITE_ENABLE_EXPENSIVE_ASSERT
  /* If expensive assert() statements are available, do a linear search
  ** of the wal-index file content. Make sure the results agree with the
  ** result obtained using the hash indexes above.  */
  {
    u32 iRead2 = 0;
    u32 iTest;
    assert( pWal->bShmUnreliable || pWal->minFrame>0 );
    for(iTest=iLast; iTest>=pWal->minFrame && iTest>0; iTest--){
      if( walFramePgno(pWal, iTest)==pgno ){
        iRead2 = iTest;
        break;
      }
    }
    assert( iRead==iRead2 );
  }
#endif

  *piRead = iRead;
  return SQLITE_OK;
}